

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void FCanvasTextureInfo::Add(AActor *viewpoint,FTextureID picnum,int fov)

{
  FCanvasTextureInfo **ppFVar1;
  FCanvasTextureInfo *pFVar2;
  AActor *pAVar3;
  FCanvasTexture *pFVar4;
  
  if (0 < picnum.texnum) {
    if ((uint)picnum.texnum < TexMan.Textures.Count) {
      pFVar4 = (FCanvasTexture *)TexMan.Textures.Array[(uint)picnum.texnum].Texture;
    }
    else {
      pFVar4 = (FCanvasTexture *)0x0;
    }
    if (((pFVar4->super_FTexture).field_0x31 & 0x20) == 0) {
      Printf("%s is not a valid target for a camera\n",(pFVar4->super_FTexture).Name.Chars);
      return;
    }
    ppFVar1 = &List;
    do {
      ppFVar1 = &((FCanvasTextureInfo *)ppFVar1)->Next->Next;
      if ((FCanvasTextureInfo *)ppFVar1 == (FCanvasTextureInfo *)0x0) {
        pFVar2 = (FCanvasTextureInfo *)operator_new(0x20);
        (pFVar2->Viewpoint).field_0.p = viewpoint;
        pFVar2->Texture = pFVar4;
        (pFVar2->PicNum).texnum = picnum.texnum;
        pFVar2->FOV = fov;
        pFVar2->Next = List;
        pFVar4->bFirstUpdate = true;
        List = pFVar2;
        return;
      }
    } while (((FCanvasTextureInfo *)ppFVar1)->Texture != pFVar4);
    pAVar3 = (((FCanvasTextureInfo *)ppFVar1)->Viewpoint).field_0.p;
    if ((pAVar3 != (AActor *)0x0) &&
       (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (((FCanvasTextureInfo *)ppFVar1)->Viewpoint).field_0.p = (AActor *)0x0;
      pAVar3 = (AActor *)0x0;
    }
    if ((pAVar3 != viewpoint) || (((FCanvasTextureInfo *)ppFVar1)->FOV != fov)) {
      pFVar4->bFirstUpdate = true;
    }
    (((FCanvasTextureInfo *)ppFVar1)->Viewpoint).field_0.p = viewpoint;
    ((FCanvasTextureInfo *)ppFVar1)->FOV = fov;
  }
  return;
}

Assistant:

void R_SetFOV (DAngle fov)
{

	if (fov < 5.) fov = 5.;
	else if (fov > 170.) fov = 170.;
	if (fov != FieldOfView)
	{
		FieldOfView = fov;
		setsizeneeded = true;
	}
}